

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O0

timer_id_t __thiscall
so_5::timers_details::
actual_thread_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
::schedule(actual_thread_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
           *this,type_index *type_index,mbox_t *mbox,message_ref_t *msg,duration pause,
          duration period)

{
  basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
  *this_00;
  pointer paVar1;
  timer_holder_t *o;
  rep in_stack_00000008;
  intrusive_ptr_t<so_5::timer_t> local_b8;
  anon_class_24_3_67f5ac77 local_b0;
  timer_action local_98;
  duration<long,_std::ratio<1L,_1000000000L>_> local_78;
  duration<long,_std::ratio<1L,_1000000000L>_> local_70;
  timer_object_holder<timertt::thread_safety::safe> local_58;
  pointer local_50;
  unique_ptr<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>,_std::default_delete<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>_>
  local_48;
  unique_ptr<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>,_std::default_delete<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>_>
  timer;
  message_ref_t *msg_local;
  mbox_t *mbox_local;
  type_index *type_index_local;
  actual_thread_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
  *this_local;
  duration period_local;
  duration pause_local;
  
  timer._M_t.
  super___uniq_ptr_impl<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>,_std::default_delete<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_*,_std::default_delete<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>_>
  .
  super__Head_base<0UL,_so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>,_std::default_delete<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>,_true,_true>
        )(__uniq_ptr_data<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>,_std::default_delete<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>,_true,_true>
          )pause.__r;
  local_50 = std::
             unique_ptr<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_std::default_delete<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>
             ::get((unique_ptr<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_std::default_delete<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>
                    *)(type_index + 1));
  stdcpp::
  make_unique<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>,timertt::timer_heap_thread_template<std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>*>
            ((stdcpp *)&local_48,&local_50);
  this_00 = (basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
             *)std::
               unique_ptr<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_std::default_delete<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>
               ::operator->((unique_ptr<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_std::default_delete<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>
                             *)(type_index + 1));
  paVar1 = std::
           unique_ptr<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>,_std::default_delete<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>_>
           ::operator->(&local_48);
  o = actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
      ::timer_holder(paVar1);
  timertt::timer_object_holder<timertt::thread_safety::safe>::timer_object_holder(&local_58,o);
  local_78.__r = in_stack_00000008;
  local_b0.type_index._M_target = (type_info *)mbox->m_obj;
  local_70.__r = period.__r;
  intrusive_ptr_t<so_5::abstract_message_box_t>::intrusive_ptr_t
            (&local_b0.mbox,(intrusive_ptr_t<so_5::abstract_message_box_t> *)msg);
  intrusive_ptr_t<so_5::message_t>::intrusive_ptr_t
            (&local_b0.msg,
             (intrusive_ptr_t<so_5::message_t> *)
             timer._M_t.
             super___uniq_ptr_impl<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>,_std::default_delete<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_*,_std::default_delete<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>_>
             .
             super__Head_base<0UL,_so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_*,_false>
             ._M_head_impl);
  std::function<void()>::
  function<so_5::timers_details::actual_thread_t<timertt::timer_heap_thread_template<std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>::schedule(std::type_index_const&,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::intrusive_ptr_t<so_5::message_t>const&,std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>)::_lambda()_1_,void>
            ((function<void()> *)&local_98,&local_b0);
  timertt::details::
  basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
  ::
  activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (this_00,&local_58,local_70,local_78,&local_98);
  std::function<void_()>::~function(&local_98);
  actual_thread_t<timertt::timer_heap_thread_template<std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>
  ::
  schedule(std::type_index_const&,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::intrusive_ptr_t<so_5::message_t>const&,std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>)
  ::{lambda()#1}::~duration((_lambda___1_ *)&local_b0);
  timertt::timer_object_holder<timertt::thread_safety::safe>::~timer_object_holder(&local_58);
  paVar1 = std::
           unique_ptr<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>,_std::default_delete<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>_>
           ::release(&local_48);
  intrusive_ptr_t<so_5::timer_t>::intrusive_ptr_t(&local_b8,&paVar1->super_timer_t);
  timer_id_t::timer_id_t((timer_id_t *)this,&local_b8);
  intrusive_ptr_t<so_5::timer_t>::~intrusive_ptr_t(&local_b8);
  std::
  unique_ptr<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>,_std::default_delete<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>_>
  ::~unique_ptr(&local_48);
  return (timer_id_t)(intrusive_ptr_t<so_5::timer_t>)this;
}

Assistant:

virtual timer_id_t
		schedule(
			const std::type_index & type_index,
			const mbox_t & mbox,
			const message_ref_t & msg,
			std::chrono::steady_clock::duration pause,
			std::chrono::steady_clock::duration period ) override
			{
				auto timer = stdcpp::make_unique< timer_demand_t >( m_thread.get() );

				m_thread->activate( timer->timer_holder(),
						pause,
						period,
						[type_index, mbox, msg]()
						{
							::so_5::rt::impl::mbox_iface_for_timers_t{ mbox }
									.deliver_message_from_timer( type_index, msg );
						} );

				return timer_id_t( timer.release() );
			}